

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.hpp
# Opt level: O2

Molecule * __thiscall OpenMD::SimInfo::getMoleculeByGlobalIndex(SimInfo *this,int index)

{
  iterator iVar1;
  Molecule *pMVar2;
  int local_c;
  
  local_c = index;
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_OpenMD::Molecule_*>,_std::_Select1st<std::pair<const_int,_OpenMD::Molecule_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_OpenMD::Molecule_*>_>_>
          ::find(&(this->molecules_)._M_t,&local_c);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->molecules_)._M_t._M_impl.super__Rb_tree_header) {
    pMVar2 = (Molecule *)0x0;
  }
  else {
    pMVar2 = (Molecule *)iVar1._M_node[1]._M_parent;
  }
  return pMVar2;
}

Assistant:

Molecule* getMoleculeByGlobalIndex(int index) {
      MoleculeIterator i;
      i = molecules_.find(index);

      return i != molecules_.end() ? i->second : NULL;
    }